

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> * __thiscall
DistanceGraph::find_all_paths_between
          (vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
           *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t from,sgNodeID_t to,
          int64_t max_size,int max_nodes,bool abort_on_loops)

{
  int iVar1;
  sgNodeID_t sVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 uVar8;
  pointer pLVar9;
  ulong uVar10;
  pointer pTVar11;
  pointer pTVar12;
  pointer pTVar13;
  ostream *poVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *pvVar18;
  pointer pLVar19;
  SequenceDistanceGraph *__args;
  ulong uVar20;
  ulong uVar21;
  pointer pTVar22;
  long lVar23;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *pvVar24;
  _Vector_base<T,_std::allocator<T>_> *p_Var25;
  vector<Link,_std::allocator<Link>_> fwl;
  vector<long,_std::allocator<long>_> pp;
  ulong local_e8;
  pointer local_e0;
  pointer local_d8;
  vector<Link,_std::allocator<Link>_> local_a0;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> local_88;
  vector<long,_std::allocator<long>_> local_68;
  sgNodeID_t local_50;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *local_48;
  int64_t local_40;
  pointer local_38;
  
  pTVar11 = (pointer)operator_new(3200000);
  local_e0 = pTVar11 + 100000;
  local_88.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __args = (SequenceDistanceGraph *)this;
  local_50 = from;
  local_48 = __return_storage_ptr__;
  get_fw_links(&local_a0,this,from);
  pLVar9 = local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_d8 = pTVar11;
  for (pLVar19 = local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                 super__Vector_impl_data._M_start; pLVar19 != pLVar9; pLVar19 = pLVar19 + 1) {
    lVar23 = pLVar19->dest;
    if ((lVar23 == to) &&
       (local_88.
        super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_88.
        super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      __args = this->sdg;
      std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
      emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                ((vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>> *)
                 &local_88,__args,&local_68);
    }
    else {
      lVar16 = -lVar23;
      if (0 < lVar23) {
        lVar16 = lVar23;
      }
      uVar15 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16].sequence._M_string_length;
      if (uVar15 <= (ulong)max_size) {
        if (local_d8 == local_e0) {
          lVar23 = (long)local_d8 - (long)pTVar11;
          if (lVar23 == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar20 = lVar23 >> 5;
          uVar17 = uVar20;
          if (local_d8 == pTVar11) {
            uVar17 = 1;
          }
          p_Var25 = (_Vector_base<T,_std::allocator<T>_> *)(uVar17 + uVar20);
          if ((_Vector_base<T,_std::allocator<T>_> *)0x3fffffffffffffe < p_Var25) {
            p_Var25 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
          }
          if (CARRY8(uVar17,uVar20)) {
            p_Var25 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
          }
          pTVar13 = std::_Vector_base<T,_std::allocator<T>_>::_M_allocate(p_Var25,(size_t)__args);
          sVar2 = pLVar19->dest;
          *(undefined8 *)((long)pTVar13 + lVar23) = 0xffffffffffffffff;
          *(sgNodeID_t *)((long)pTVar13 + lVar23 + 8) = sVar2;
          *(undefined4 *)((long)pTVar13 + lVar23 + 0x10) = 1;
          *(ulong *)((long)pTVar13 + lVar23 + 0x18) = uVar15;
          pTVar22 = pTVar13;
          for (pTVar12 = pTVar11; local_d8 != pTVar12; pTVar12 = pTVar12 + 1) {
            iVar7 = pTVar12->prev;
            uVar4 = *(undefined4 *)((long)&pTVar12->prev + 4);
            sVar2 = pTVar12->node;
            uVar5 = *(undefined4 *)((long)&pTVar12->node + 4);
            uVar8 = *(undefined4 *)&pTVar12->field_0x14;
            iVar6 = pTVar12->partial_size;
            pTVar22->node_count = pTVar12->node_count;
            *(undefined4 *)&pTVar22->field_0x14 = uVar8;
            pTVar22->partial_size = iVar6;
            *(int *)&pTVar22->prev = (int)iVar7;
            *(undefined4 *)((long)&pTVar22->prev + 4) = uVar4;
            *(int *)&pTVar22->node = (int)sVar2;
            *(undefined4 *)((long)&pTVar22->node + 4) = uVar5;
            pTVar22 = pTVar22 + 1;
          }
          if (pTVar11 != (pointer)0x0) {
            __args = (SequenceDistanceGraph *)((long)local_e0 - (long)pTVar11);
            operator_delete(pTVar11,(ulong)__args);
          }
          local_d8 = pTVar22 + 1;
          local_e0 = pTVar13 + (long)p_Var25;
          pTVar11 = pTVar13;
        }
        else {
          local_d8->prev = -1;
          local_d8->node = lVar23;
          local_d8->node_count = 1;
          local_d8->partial_size = uVar15;
          local_d8 = local_d8 + 1;
        }
      }
    }
  }
  if (local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar24 = local_48;
  if ((local_d8 != pTVar11) && ((ulong)((long)local_d8 - (long)pTVar11) < 0x1e84820)) {
    local_e8 = 0;
    while ((ulong)((long)local_88.
                         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.
                        super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 0x7d20) {
      iVar1 = pTVar11[local_e8].node_count;
      local_40 = pTVar11[local_e8].partial_size;
      get_fw_links(&local_a0,this,pTVar11[local_e8].node);
      local_38 = local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        bVar3 = true;
      }
      else {
        pLVar19 = local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          lVar23 = pLVar19->dest;
          if (lVar23 == to) {
            std::vector<long,_std::allocator<long>_>::resize(&local_68,(long)iVar1);
            for (uVar15 = local_e8; uVar15 != 0xffffffffffffffff; uVar15 = pTVar11[uVar15].prev) {
              local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)pTVar11[uVar15].node_count + -1] =
                   pTVar11[uVar15].node;
            }
            if ((abort_on_loops) &&
               ((long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start != 0)) {
              uVar15 = (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3;
              uVar17 = uVar15 + (uVar15 == 0);
              lVar23 = *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar20 = 0;
              do {
                bVar3 = true;
                if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar20] != lVar23) {
                  uVar10 = 1;
                  do {
                    uVar21 = uVar10;
                    if (uVar17 == uVar21) {
                      bVar3 = uVar21 < uVar15;
                      goto LAB_0017cdfe;
                    }
                    uVar10 = uVar21 + 1;
                  } while (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar20] !=
                           local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar21]);
                  bVar3 = uVar21 < uVar15;
                }
                (pvVar24->
                super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (pvVar24->
                super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (pvVar24->
                super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0017cdfe:
              } while ((!bVar3) && (uVar20 = uVar20 + 1, uVar20 != uVar17));
              if (bVar3) {
                bVar3 = false;
                goto LAB_0017cead;
              }
            }
            std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
            emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                      ((vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>
                        *)&local_88,this->sdg,&local_68);
            pTVar13 = pTVar11;
LAB_0017ce73:
            bVar3 = true;
            pTVar11 = pTVar13;
          }
          else {
            lVar16 = -lVar23;
            if (0 < lVar23) {
              lVar16 = lVar23;
            }
            uVar15 = pLVar19->dist + local_40 +
                     (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16].sequence._M_string_length;
            bVar3 = true;
            if (uVar15 <= (ulong)max_size && iVar1 <= max_nodes) {
              if (local_d8 == local_e0) {
                lVar23 = (long)local_d8 - (long)pTVar11;
                if (lVar23 == 0x7fffffffffffffe0) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar20 = lVar23 >> 5;
                uVar17 = uVar20;
                if (local_d8 == pTVar11) {
                  uVar17 = 1;
                }
                p_Var25 = (_Vector_base<T,_std::allocator<T>_> *)(uVar17 + uVar20);
                if ((_Vector_base<T,_std::allocator<T>_> *)0x3fffffffffffffe < p_Var25) {
                  p_Var25 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
                }
                if (CARRY8(uVar17,uVar20)) {
                  p_Var25 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
                }
                pTVar13 = std::_Vector_base<T,_std::allocator<T>_>::_M_allocate
                                    (p_Var25,lVar16 * 0x38);
                sVar2 = pLVar19->dest;
                *(ulong *)((long)pTVar13 + lVar23) = local_e8;
                *(sgNodeID_t *)((long)pTVar13 + lVar23 + 8) = sVar2;
                *(int *)((long)pTVar13 + lVar23 + 0x10) = iVar1 + 1;
                *(ulong *)((long)pTVar13 + lVar23 + 0x18) = uVar15;
                pTVar22 = pTVar13;
                for (pTVar12 = pTVar11; local_d8 != pTVar12; pTVar12 = pTVar12 + 1) {
                  iVar7 = pTVar12->prev;
                  uVar4 = *(undefined4 *)((long)&pTVar12->prev + 4);
                  sVar2 = pTVar12->node;
                  uVar5 = *(undefined4 *)((long)&pTVar12->node + 4);
                  uVar8 = *(undefined4 *)&pTVar12->field_0x14;
                  iVar6 = pTVar12->partial_size;
                  pTVar22->node_count = pTVar12->node_count;
                  *(undefined4 *)&pTVar22->field_0x14 = uVar8;
                  pTVar22->partial_size = iVar6;
                  *(int *)&pTVar22->prev = (int)iVar7;
                  *(undefined4 *)((long)&pTVar22->prev + 4) = uVar4;
                  *(int *)&pTVar22->node = (int)sVar2;
                  *(undefined4 *)((long)&pTVar22->node + 4) = uVar5;
                  pTVar22 = pTVar22 + 1;
                }
                if (pTVar11 != (pointer)0x0) {
                  operator_delete(pTVar11,(long)local_e0 - (long)pTVar11);
                }
                local_d8 = pTVar22 + 1;
                local_e0 = pTVar13 + (long)p_Var25;
                pvVar24 = local_48;
                goto LAB_0017ce73;
              }
              local_d8->prev = local_e8;
              local_d8->node = lVar23;
              local_d8->node_count = iVar1 + 1;
              local_d8->partial_size = uVar15;
              local_d8 = local_d8 + 1;
            }
          }
LAB_0017cead:
        } while ((bVar3) && (pLVar19 = pLVar19 + 1, pLVar19 != local_38));
      }
      if (local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar3) goto LAB_0017d215;
      local_e8 = local_e8 + 1;
      uVar15 = (long)local_d8 - (long)pTVar11 >> 5;
      if ((uVar15 <= local_e8) || (1000000 < uVar15)) break;
    }
  }
  if ((long)local_d8 - (long)pTVar11 == 32000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
    poVar14 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," to ",4);
    poVar14 = std::ostream::_M_insert<long>((long)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," with max_size ",0xf);
    poVar14 = std::ostream::_M_insert<long>((long)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," and max_nodes ",0xf);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,max_nodes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," there were too many nodes!",0x1b);
    std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  pvVar18 = pvVar24;
  if ((long)local_88.
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_88.
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            ._M_impl.super__Vector_impl_data._M_start == 32000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
    poVar14 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," to ",4);
    poVar14 = std::ostream::_M_insert<long>((long)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," with max_size ",0xf);
    poVar14 = std::ostream::_M_insert<long>((long)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," and max_nodes ",0xf);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,max_nodes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," there were too many paths!",0x1b);
    std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  else if ((long)local_d8 - (long)pTVar11 != 32000000) {
    (pvVar24->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pvVar24->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pvVar18 = &local_88;
    (pvVar24->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (pvVar18->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar18->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar18->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0017d215:
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::~vector
            (&local_88);
  if (pTVar11 != (pointer)0x0) {
    operator_delete(pTVar11,(long)local_e0 - (long)pTVar11);
  }
  return pvVar24;
}

Assistant:

std::vector<SequenceDistanceGraphPath> DistanceGraph::find_all_paths_between(sgNodeID_t from,sgNodeID_t to, int64_t max_size, int max_nodes, bool abort_on_loops) const {
    typedef struct T {
        int64_t prev;
        sgNodeID_t node;
        int node_count;
        int64_t partial_size;
        T(uint64_t a, sgNodeID_t b, int c, int64_t d) : prev(a),node(b),node_count(c),partial_size(d){};
    } pathNodeEntry_t;

    std::vector<pathNodeEntry_t> node_entries;
    node_entries.reserve(100000);
    std::vector<SequenceDistanceGraphPath> final_paths;
    std::vector<sgNodeID_t> pp;

    for(auto &fl:get_fw_links(from)) {
        if (fl.dest==to and final_paths.empty()) {
            final_paths.emplace_back(sdg,pp);
        }
        else if (sdg.nodes[llabs(fl.dest)].sequence.size()<=max_size) {
            node_entries.emplace_back(-1, fl.dest, 1, sdg.nodes[llabs(fl.dest)].sequence.size());
        }
    }


    // XXX: This loop is growing forever on node 2083801 for backbone 58, the limits are heuristics to cap the complexity of regions captured
    for (uint64_t current_index=0;current_index<node_entries.size() and node_entries.size() < 1000001 and final_paths.size() < 1001;++current_index){
        auto current_entry=node_entries[current_index];
        auto fwl=get_fw_links(current_entry.node);
        for(auto &fl:fwl) {
            if (fl.dest==to){
                //reconstruct path backwards
                pp.resize(current_entry.node_count);

                for (uint64_t ei=current_index;ei!=-1;ei=node_entries[ei].prev){
                    pp[node_entries[ei].node_count-1]=node_entries[ei].node;
                }
                //check if there are any loops
                if (abort_on_loops) {
                    for (auto i1 = 0; i1 < pp.size(); ++i1) {
                        for (auto i2 = 0; i2 < pp.size(); ++i2) {
                            if (pp[i1]==pp[i2]) {
                                return {};
                            }
                        }
                    }
                }
                //add to solutions
                final_paths.emplace_back(sdg,pp);
            }
            else {
                uint64_t new_size=current_entry.partial_size+fl.dist+sdg.nodes[llabs(fl.dest)].sequence.size();
                if (new_size<=max_size and current_entry.node_count<=max_nodes) {
                    node_entries.emplace_back(current_index, fl.dest, current_entry.node_count+1, new_size);
                }
            }
        }

    }

    bool early_exit=false;
    if (node_entries.size() == 1000000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many nodes!"<< std::endl;
        early_exit = true;
    }

    if (final_paths.size() == 1000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many paths!"<< std::endl;
        early_exit = true;
    }

    if (early_exit) return {};
    return final_paths;
}